

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classweight.cc
# Opt level: O1

base_learner * classweight_setup(options_i *options,vw *all)

{
  prediction_type_t pred_type;
  pointer pbVar1;
  int iVar2;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  ostream *poVar3;
  base_learner *l;
  single_learner *base;
  learner<CLASSWEIGHTS::classweights,_example> *plVar4;
  vw_exception *this_00;
  code *predict;
  code *learn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  string *source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classweight_array;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  _func_int ***local_298;
  _func_int **local_290;
  _func_int **local_288 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  long local_258;
  option_group_definition local_250;
  long *local_218;
  long local_210;
  long local_208 [2];
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [23];
  undefined4 uStack_1a1;
  undefined1 local_19d;
  string local_188 [88];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          *)calloc_or_throw<CLASSWEIGHTS::classweights>(1);
  (((unordered_map<unsigned_int,_float,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
     *)&this->_M_buckets)->_M_h)._M_buckets = (__buckets_ptr)0x0;
  this->_M_bucket_count = 0;
  *(undefined8 *)&this->_M_rehash_policy = 0;
  (this->_M_rehash_policy)._M_next_resize = 0;
  (this->_M_before_begin)._M_nxt = (_Hash_node_base *)0x0;
  this->_M_element_count = 0;
  this->_M_single_bucket = (__node_base_ptr)0x0;
  (((unordered_map<unsigned_int,_float,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
     *)&this->_M_buckets)->_M_h)._M_buckets = &this->_M_single_bucket;
  this->_M_bucket_count = 1;
  (this->_M_rehash_policy)._M_max_load_factor = 1.0;
  (this->_M_rehash_policy)._M_next_resize = 0;
  this->_M_single_bucket = (__node_base_ptr)0x0;
  local_1b8._0_8_ = (_func_int **)0x19;
  local_298 = local_288;
  local_298 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_298,(ulong)local_1b8);
  local_288[0] = (_func_int **)local_1b8._0_8_;
  builtin_strncpy((char *)((long)local_298 + 9),"e weight",8);
  builtin_strncpy((char *)((long)local_298 + 0x11)," classes",8);
  *(undefined4 *)local_298 = 0x6f706d69;
  builtin_strncpy((char *)((long)local_298 + 4),"rtan",4);
  *(undefined4 *)(local_298 + 1) = 0x77206563;
  builtin_strncpy((char *)((long)local_298 + 0xc),"eigh",4);
  local_290 = (_func_int **)local_1b8._0_8_;
  *(char *)((long)local_298 + local_1b8._0_8_) = '\0';
  local_250.m_name._M_dataplus._M_p = (pointer)&local_250.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,local_298,(char *)(local_1b8._0_8_ + (long)local_298));
  local_250.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_250.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_250.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  local_1f8.field_2._M_allocated_capacity._0_7_ = 0x65777373616c63;
  local_1f8.field_2._7_4_ = 0x74686769;
  local_1f8._M_string_length = 0xb;
  local_1f8.field_2._M_local_buf[0xb] = '\0';
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1b8,&local_1f8,&local_278);
  local_258 = 0x26;
  local_218 = local_208;
  local_218 = (long *)std::__cxx11::string::_M_create((ulong *)&local_218,(ulong)&local_258);
  local_208[0] = local_258;
  local_218[2] = 0x7069746c756d2074;
  local_218[3] = 0x726f66207265696c;
  *local_218 = 0x6e6174726f706d69;
  local_218[1] = 0x6867696577206563;
  builtin_strncpy((char *)((long)local_218 + 0x1e),"or class",8);
  local_210 = local_258;
  *(char *)((long)local_218 + local_258) = '\0';
  std::__cxx11::string::_M_assign(local_188);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            (&local_250,
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1b8);
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  local_1b8._0_8_ = &PTR__typed_option_002d85a0;
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
  }
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_250);
  local_1b8._16_7_ = 0x65777373616c63;
  uStack_1a1 = 0x74686769;
  local_1b8._8_8_ = (pointer)0xb;
  local_19d = '\0';
  local_1b8._0_8_ = local_1b8 + 0x10;
  iVar2 = (*options->_vptr_options_i[1])(options,local_1b8);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_);
  }
  pbVar1 = local_278.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  source = local_278.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((char)iVar2 == '\0') {
    plVar4 = (learner<CLASSWEIGHTS::classweights,_example> *)0x0;
  }
  else {
    for (; source != pbVar1; source = source + 1) {
      CLASSWEIGHTS::classweights::load_string((classweights *)this,source);
    }
    if (all->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(all->trace_message).super_ostream,"parsed ",7);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&all->trace_message);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," class weights",0xe);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    pred_type = *(prediction_type_t *)(base + 0xd0);
    if (pred_type == multiclass) {
      predict = CLASSWEIGHTS::predict_or_learn<false,4>;
      learn = CLASSWEIGHTS::predict_or_learn<true,4>;
    }
    else {
      if (pred_type != scalar) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),
                   "--classweight not implemented for this type of prediction",0x39);
        this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this_00,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/classweight.cc"
                   ,100,&local_1d8);
        __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      predict = CLASSWEIGHTS::predict_or_learn<false,0>;
      learn = CLASSWEIGHTS::predict_or_learn<true,0>;
    }
    plVar4 = LEARNER::learner<CLASSWEIGHTS::classweights,example>::
             init_learner<LEARNER::learner<char,example>>
                       ((classweights *)this,base,learn,predict,1,pred_type);
    *(undefined8 *)(plVar4 + 0xb8) = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0xc0) = *(undefined8 *)(plVar4 + 0x20);
    *(code **)(plVar4 + 200) = CLASSWEIGHTS::finish;
    this = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_250.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.m_name._M_dataplus._M_p != &local_250.m_name.field_2) {
    operator_delete(local_250.m_name._M_dataplus._M_p);
  }
  if (this != (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)0x0) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(this);
    free(this);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  return (base_learner *)plVar4;
}

Assistant:

LEARNER::base_learner* classweight_setup(options_i& options, vw& all)
{
  vector<string> classweight_array;
  auto cweights = scoped_calloc_or_throw<classweights>();
  option_group_definition new_options("importance weight classes");
  new_options.add(make_option("classweight", classweight_array).help("importance weight multiplier for class"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("classweight"))
    return nullptr;

  for (auto& s : classweight_array) cweights->load_string(s);

  if (!all.quiet)
    all.trace_message << "parsed " << cweights->weights.size() << " class weights" << endl;

  LEARNER::single_learner* base = as_singleline(setup_base(options, all));

  LEARNER::learner<classweights, example>* ret;
  if (base->pred_type == prediction_type::scalar)
    ret = &LEARNER::init_learner<classweights>(cweights, base, predict_or_learn<true, prediction_type::scalar>,
        predict_or_learn<false, prediction_type::scalar>);
  else if (base->pred_type == prediction_type::multiclass)
    ret = &LEARNER::init_learner<classweights>(cweights, base, predict_or_learn<true, prediction_type::multiclass>,
        predict_or_learn<false, prediction_type::multiclass>);
  else
    THROW("--classweight not implemented for this type of prediction");
  ret->set_finish(finish);
  return make_base(*ret);
}